

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O0

void ProcessEDMapthing(FMapThing *mt,int recordnum)

{
  EDMapthing *pEVar1;
  FDoomEdEntry *pFVar2;
  EDMapthing *emt;
  int recordnum_local;
  FMapThing *mt_local;
  
  InitED();
  pEVar1 = TMap<int,_EDMapthing,_THashTraits<int>,_TValueTraits<EDMapthing>_>::CheckKey
                     (&EDThings,recordnum);
  if (pEVar1 == (EDMapthing *)0x0) {
    Printf("EDF Mapthing record %d not found\n",(ulong)(uint)recordnum);
    mt->EdNum = 0;
  }
  else {
    mt->thingid = pEVar1->tid;
    mt->EdNum = (short)pEVar1->type;
    pFVar2 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                       (&DoomEdMap,(int)mt->EdNum);
    mt->info = pFVar2;
    (mt->pos).Z = pEVar1->height;
    *(undefined8 *)mt->args = *(undefined8 *)pEVar1->args;
    *(undefined8 *)(mt->args + 2) = *(undefined8 *)(pEVar1->args + 2);
    mt->args[4] = pEVar1->args[4];
    mt->SkillFilter = pEVar1->skillfilter;
    mt->flags = pEVar1->flags;
  }
  return;
}

Assistant:

void ProcessEDMapthing(FMapThing *mt, int recordnum)
{
	InitED();

	EDMapthing *emt = EDThings.CheckKey(recordnum);
	if (emt == NULL)
	{
		Printf("EDF Mapthing record %d not found\n", recordnum);
		mt->EdNum = 0;
		return;
	}
	mt->thingid = emt->tid;
	mt->EdNum = emt->type;
	mt->info = DoomEdMap.CheckKey(mt->EdNum);
	mt->pos.Z = emt->height;
	memcpy(mt->args, emt->args, sizeof(mt->args));
	mt->SkillFilter = emt->skillfilter;
	mt->flags = emt->flags;
}